

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

int tcu::anon_unknown_50::findNumPositionDeviationFailingPixels
              (PixelBufferAccess *errorMask,ConstPixelBufferAccess *reference,
              ConstPixelBufferAccess *result,UVec4 *threshold,IVec3 *maxPositionDeviation,
              bool acceptOutOfBoundsAsAnyValue)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  int z;
  uint uVar4;
  InternalError *this;
  int iVar5;
  int iVar6;
  int iVar7;
  int y;
  undefined3 in_register_00000089;
  int iVar8;
  int iVar9;
  int z_00;
  uint uVar10;
  int local_f8;
  int local_f4;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  UVec4 diff_1;
  UVec4 diff;
  IVec4 local_98;
  void *local_88;
  int aiStack_80 [4];
  tcu local_70 [16];
  IVec4 cmpPix;
  IVec4 refPix;
  tcu local_40 [16];
  
  local_88 = (void *)0xff00000000;
  aiStack_80[0] = 0;
  aiStack_80[1] = 0xff;
  local_98.m_data[0] = 0xff;
  local_98.m_data[1] = 0;
  local_98.m_data[2] = 0;
  local_98.m_data[3] = 0xff;
  iVar5 = (reference->m_size).m_data[0];
  iVar1 = (reference->m_size).m_data[1];
  iVar2 = (reference->m_size).m_data[2];
  z_00 = 0;
  local_f0 = 0;
  local_f8 = 0;
  local_f4 = iVar2;
  local_ec = iVar1;
  local_e4 = iVar5;
  if (CONCAT31(in_register_00000089,acceptOutOfBoundsAsAnyValue) != 0) {
    local_f0 = maxPositionDeviation->m_data[0];
    local_f8 = maxPositionDeviation->m_data[1];
    z_00 = maxPositionDeviation->m_data[2];
    local_e4 = iVar5 - local_f0;
    local_ec = iVar1 - local_f8;
    local_f4 = iVar2 - z_00;
  }
  if ((((result->m_size).m_data[0] != iVar5) || ((result->m_size).m_data[1] != iVar1)) ||
     ((result->m_size).m_data[2] != iVar2)) {
    this = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x6c);
    __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
  }
  tcu::clear(errorMask,(IVec4 *)&local_88);
  iVar2 = iVar2 + -1;
  iVar1 = iVar1 + -1;
  iVar5 = iVar5 + -1;
  local_e8 = 0;
  do {
    z = local_f8;
    if (local_f4 <= z_00) {
      return local_e8;
    }
    for (; y = local_f0, z < local_ec; z = z + 1) {
      for (; y < local_e4; y = y + 1) {
        ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&refPix,(int)reference,y,z);
        ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&cmpPix,(int)result,y,z);
        operator-(local_40,(Vector<int,_4> *)&refPix,(Vector<int,_4> *)&cmpPix);
        abs<int,4>((tcu *)&diff_1,(Vector<int,_4> *)local_40);
        Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&diff);
        lessThanEqual<unsigned_int,4>((tcu *)&diff_1,&diff,threshold);
        bVar3 = boolAll<4>((Vector<bool,_4> *)&diff_1);
        if (!bVar3) {
          iVar6 = maxPositionDeviation->m_data[2];
          uVar4 = 0;
          uVar10 = z_00 - iVar6;
          if (z_00 - iVar6 < 1) {
            uVar10 = uVar4;
          }
          while( true ) {
            iVar8 = iVar6 + z_00;
            if (iVar2 < iVar6 + z_00) {
              iVar8 = iVar2;
            }
            if ((iVar8 < (int)uVar10) || (uVar4 != 0)) break;
            iVar6 = maxPositionDeviation->m_data[1];
            iVar8 = z - iVar6;
            if (iVar8 < 1) {
              iVar8 = 0;
            }
            while( true ) {
              iVar9 = iVar6 + z;
              if (iVar1 < iVar6 + z) {
                iVar9 = iVar1;
              }
              if ((iVar9 < iVar8) || (uVar4 != 0)) break;
              iVar6 = maxPositionDeviation->m_data[0];
              iVar9 = y - iVar6;
              if (iVar9 < 1) {
                iVar9 = 0;
              }
              while( true ) {
                iVar7 = iVar6 + y;
                if (iVar5 < iVar6 + y) {
                  iVar7 = iVar5;
                }
                if ((iVar7 < iVar9) || (uVar4 != 0)) break;
                ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)&diff,(int)result,iVar9,iVar8);
                operator-(local_70,&refPix,(Vector<int,_4> *)&diff);
                abs<int,4>(local_40,(Vector<int,_4> *)local_70);
                Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&diff_1);
                lessThanEqual<unsigned_int,4>(local_40,&diff_1,threshold);
                bVar3 = boolAll<4>((Vector<bool,_4> *)local_40);
                uVar4 = (uint)bVar3;
                iVar9 = iVar9 + 1;
                iVar6 = maxPositionDeviation->m_data[0];
              }
              iVar8 = iVar8 + 1;
              iVar6 = maxPositionDeviation->m_data[1];
            }
            iVar6 = maxPositionDeviation->m_data[2];
            uVar10 = uVar10 + 1;
          }
          if (uVar4 != 0) {
            uVar4 = 0;
            uVar10 = z_00 - iVar6;
            if (z_00 - iVar6 < 1) {
              uVar10 = uVar4;
            }
            while( true ) {
              iVar8 = iVar6 + z_00;
              if (iVar2 < iVar6 + z_00) {
                iVar8 = iVar2;
              }
              if ((iVar8 < (int)uVar10) || (uVar4 != 0)) break;
              iVar6 = maxPositionDeviation->m_data[1];
              iVar8 = z - iVar6;
              if (iVar8 < 1) {
                iVar8 = 0;
              }
              while( true ) {
                iVar9 = iVar6 + z;
                if (iVar1 < iVar6 + z) {
                  iVar9 = iVar1;
                }
                if ((iVar9 < iVar8) || (uVar4 != 0)) break;
                iVar6 = maxPositionDeviation->m_data[0];
                iVar9 = y - iVar6;
                if (iVar9 < 1) {
                  iVar9 = 0;
                }
                while( true ) {
                  iVar7 = iVar6 + y;
                  if (iVar5 < iVar6 + y) {
                    iVar7 = iVar5;
                  }
                  if ((iVar7 < iVar9) || (uVar4 != 0)) break;
                  ConstPixelBufferAccess::getPixelInt
                            ((ConstPixelBufferAccess *)&diff,(int)reference,iVar9,iVar8);
                  operator-(local_70,&cmpPix,(Vector<int,_4> *)&diff);
                  abs<int,4>(local_40,(Vector<int,_4> *)local_70);
                  Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&diff_1);
                  lessThanEqual<unsigned_int,4>(local_40,&diff_1,threshold);
                  bVar3 = boolAll<4>((Vector<bool,_4> *)local_40);
                  uVar4 = (uint)bVar3;
                  iVar9 = iVar9 + 1;
                  iVar6 = maxPositionDeviation->m_data[0];
                }
                iVar8 = iVar8 + 1;
                iVar6 = maxPositionDeviation->m_data[1];
              }
              uVar10 = uVar10 + 1;
              iVar6 = maxPositionDeviation->m_data[2];
            }
            if (uVar4 != 0) goto LAB_002f8cc8;
          }
          PixelBufferAccess::setPixel(errorMask,&local_98,y,z,z_00);
          local_e8 = local_e8 + 1;
        }
LAB_002f8cc8:
      }
    }
    z_00 = z_00 + 1;
  } while( true );
}

Assistant:

static int findNumPositionDeviationFailingPixels (const PixelBufferAccess& errorMask, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, const tcu::IVec3& maxPositionDeviation, bool acceptOutOfBoundsAsAnyValue)
{
	const tcu::IVec4	okColor				(0, 255, 0, 255);
	const tcu::IVec4	errorColor			(255, 0, 0, 255);
	const int			width				= reference.getWidth();
	const int			height				= reference.getHeight();
	const int			depth				= reference.getDepth();
	int					numFailingPixels	= 0;

	// Accept pixels "sampling" over the image bounds pixels since "taps" could be anything
	const int			beginX				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.x()) : (0);
	const int			beginY				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.y()) : (0);
	const int			beginZ				= (acceptOutOfBoundsAsAnyValue) ? (maxPositionDeviation.z()) : (0);
	const int			endX				= (acceptOutOfBoundsAsAnyValue) ? (width  - maxPositionDeviation.x()) : (width);
	const int			endY				= (acceptOutOfBoundsAsAnyValue) ? (height - maxPositionDeviation.y()) : (height);
	const int			endZ				= (acceptOutOfBoundsAsAnyValue) ? (depth  - maxPositionDeviation.z()) : (depth);

	TCU_CHECK_INTERNAL(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);
	DE_ASSERT(endX > 0 && endY > 0 && endZ > 0);	// most likely a bug

	tcu::clear(errorMask, okColor);

	for (int z = beginZ; z < endZ; z++)
	{
		for (int y = beginY; y < endY; y++)
		{
			for (int x = beginX; x < endX; x++)
			{
				const IVec4	refPix = reference.getPixelInt(x, y, z);
				const IVec4	cmpPix = result.getPixelInt(x, y, z);

				// Exact match
				{
					const UVec4	diff = abs(refPix - cmpPix).cast<deUint32>();
					const bool	isOk = boolAll(lessThanEqual(diff, threshold));

					if (isOk)
						continue;
				}

				// Find matching pixels for both result and reference pixel

				{
					bool pixelFoundForReference = false;

					// Find deviated result pixel for reference

					for (int sz = de::max(0, z - maxPositionDeviation.z()); sz <= de::min(depth  - 1, z + maxPositionDeviation.z()) && !pixelFoundForReference; ++sz)
					for (int sy = de::max(0, y - maxPositionDeviation.y()); sy <= de::min(height - 1, y + maxPositionDeviation.y()) && !pixelFoundForReference; ++sy)
					for (int sx = de::max(0, x - maxPositionDeviation.x()); sx <= de::min(width  - 1, x + maxPositionDeviation.x()) && !pixelFoundForReference; ++sx)
					{
						const IVec4	deviatedCmpPix	= result.getPixelInt(sx, sy, sz);
						const UVec4	diff			= abs(refPix - deviatedCmpPix).cast<deUint32>();
						const bool	isOk			= boolAll(lessThanEqual(diff, threshold));

						pixelFoundForReference		= isOk;
					}

					if (!pixelFoundForReference)
					{
						errorMask.setPixel(errorColor, x, y, z);
						++numFailingPixels;
						continue;
					}
				}
				{
					bool pixelFoundForResult = false;

					// Find deviated reference pixel for result

					for (int sz = de::max(0, z - maxPositionDeviation.z()); sz <= de::min(depth  - 1, z + maxPositionDeviation.z()) && !pixelFoundForResult; ++sz)
					for (int sy = de::max(0, y - maxPositionDeviation.y()); sy <= de::min(height - 1, y + maxPositionDeviation.y()) && !pixelFoundForResult; ++sy)
					for (int sx = de::max(0, x - maxPositionDeviation.x()); sx <= de::min(width  - 1, x + maxPositionDeviation.x()) && !pixelFoundForResult; ++sx)
					{
						const IVec4	deviatedRefPix	= reference.getPixelInt(sx, sy, sz);
						const UVec4	diff			= abs(cmpPix - deviatedRefPix).cast<deUint32>();
						const bool	isOk			= boolAll(lessThanEqual(diff, threshold));

						pixelFoundForResult			= isOk;
					}

					if (!pixelFoundForResult)
					{
						errorMask.setPixel(errorColor, x, y, z);
						++numFailingPixels;
						continue;
					}
				}
			}
		}
	}

	return numFailingPixels;
}